

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O0

int amqp_decode_table(amqp_bytes_t encoded,amqp_pool_t *pool,amqp_table_t *output,size_t *offset)

{
  amqp_bytes_t encoded_00;
  amqp_bytes_t encoded_01;
  amqp_bytes_t encoded_02;
  amqp_bytes_t encoded_03;
  amqp_bytes_t *paVar1;
  int iVar2;
  amqp_bytes_t *offset_00;
  ulong uVar3;
  void *pvVar4;
  int *in_RCX;
  void *in_RDX;
  amqp_pool_t *in_R8;
  void *newentries;
  uint8_t keylen;
  int res;
  size_t limit;
  int allocated_entries;
  amqp_table_entry_t *entries;
  int num_entries;
  uint32_t tablesize;
  size_t in_stack_ffffffffffffff98;
  amqp_bytes_t *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined8 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar5;
  int iVar6;
  uint in_stack_ffffffffffffffcc;
  int local_4;
  
  iVar6 = 0;
  iVar5 = 0x10;
  encoded_00.bytes._0_4_ = in_stack_ffffffffffffffb8;
  encoded_00.len = in_stack_ffffffffffffffb0;
  encoded_00.bytes._4_4_ = 0x10;
  iVar2 = amqp_decode_32(encoded_00,
                         (size_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         (uint32_t *)in_stack_ffffffffffffffa0);
  if (iVar2 == 0) {
    local_4 = -2;
  }
  else {
    offset_00 = (amqp_bytes_t *)malloc((long)iVar5 * 0x28);
    if (offset_00 == (amqp_bytes_t *)0x0) {
      local_4 = -1;
    }
    else {
      uVar3 = in_R8->pagesize + (ulong)in_stack_ffffffffffffffcc;
      while (in_R8->pagesize < uVar3) {
        in_stack_ffffffffffffffac = -2;
        encoded_01.bytes._0_4_ = in_stack_ffffffffffffffb8;
        encoded_01.len = uVar3;
        encoded_01.bytes._4_4_ = iVar5;
        iVar2 = amqp_decode_8(encoded_01,(size_t *)CONCAT44(0xfffffffe,in_stack_ffffffffffffffa8),
                              (uint8_t *)in_stack_ffffffffffffffa0);
        if (iVar2 == 0) goto LAB_001148d2;
        paVar1 = offset_00;
        if (iVar5 <= iVar6) {
          iVar5 = iVar5 << 1;
          in_stack_ffffffffffffffa0 = (amqp_bytes_t *)realloc(offset_00,(long)iVar5 * 0x28);
          in_stack_ffffffffffffffac = -1;
          paVar1 = in_stack_ffffffffffffffa0;
          if (in_stack_ffffffffffffffa0 == (amqp_bytes_t *)0x0) goto LAB_001148d2;
        }
        offset_00 = paVar1;
        in_stack_ffffffffffffffac = -2;
        encoded_02.bytes._0_4_ = in_stack_ffffffffffffffb8;
        encoded_02.len = uVar3;
        encoded_02.bytes._4_4_ = iVar5;
        iVar2 = amqp_decode_bytes(encoded_02,
                                  (size_t *)CONCAT44(0xfffffffe,in_stack_ffffffffffffffa8),
                                  in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        if ((iVar2 == 0) ||
           (encoded_03.bytes = in_RDX, encoded_03.len = (size_t)in_RCX,
           in_stack_ffffffffffffffac =
                amqp_decode_field_value
                          (encoded_03,in_R8,
                           (amqp_field_value_t *)CONCAT44(in_stack_ffffffffffffffcc,iVar6),
                           &offset_00->len), in_stack_ffffffffffffffac < 0)) goto LAB_001148d2;
        iVar6 = iVar6 + 1;
      }
      *in_RCX = iVar6;
      pvVar4 = amqp_pool_alloc((amqp_pool_t *)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                               (size_t)in_stack_ffffffffffffffa0);
      *(void **)(in_RCX + 2) = pvVar4;
      in_stack_ffffffffffffffac = -1;
      if ((*(long *)(in_RCX + 2) != 0) || (iVar6 < 1)) {
        memcpy(*(void **)(in_RCX + 2),offset_00,(long)iVar6 * 0x28);
        in_stack_ffffffffffffffac = 0;
      }
LAB_001148d2:
      free(offset_00);
      local_4 = in_stack_ffffffffffffffac;
    }
  }
  return local_4;
}

Assistant:

int amqp_decode_table(amqp_bytes_t encoded,
                      amqp_pool_t *pool,
                      amqp_table_t *output,
                      size_t *offset)
{
  uint32_t tablesize;
  int num_entries = 0;
  amqp_table_entry_t *entries;
  int allocated_entries = INITIAL_TABLE_SIZE;
  size_t limit;
  int res;

  if (!amqp_decode_32(encoded, offset, &tablesize)) {
    return AMQP_STATUS_BAD_AMQP_DATA;
  }

  entries = malloc(allocated_entries * sizeof(amqp_table_entry_t));
  if (entries == NULL) {
    return AMQP_STATUS_NO_MEMORY;
  }

  limit = *offset + tablesize;
  while (*offset < limit) {
    uint8_t keylen;

    res = AMQP_STATUS_BAD_AMQP_DATA;
    if (!amqp_decode_8(encoded, offset, &keylen)) {
      goto out;
    }

    if (num_entries >= allocated_entries) {
      void *newentries;
      allocated_entries = allocated_entries * 2;
      newentries = realloc(entries, allocated_entries * sizeof(amqp_table_entry_t));
      res = AMQP_STATUS_NO_MEMORY;
      if (newentries == NULL) {
        goto out;
      }

      entries = newentries;
    }

    res = AMQP_STATUS_BAD_AMQP_DATA;
    if (!amqp_decode_bytes(encoded, offset, &entries[num_entries].key, keylen)) {
      goto out;
    }

    res = amqp_decode_field_value(encoded, pool, &entries[num_entries].value,
                                  offset);
    if (res < 0) {
      goto out;
    }

    num_entries++;
  }

  output->num_entries = num_entries;
  output->entries = amqp_pool_alloc(pool, num_entries * sizeof(amqp_table_entry_t));
  res = AMQP_STATUS_NO_MEMORY;
  /* NULL is legitimate if we requested a zero-length block. */
  if (output->entries == NULL && num_entries > 0) {
    goto out;
  }

  memcpy(output->entries, entries, num_entries * sizeof(amqp_table_entry_t));
  res = AMQP_STATUS_OK;

out:
  free(entries);
  return res;
}